

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_ai_lookup.hpp
# Opt level: O1

void __thiscall
PatchOptimizeAILookup::inject_code(PatchOptimizeAILookup *this,ROM *rom,World *world)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  LandstalkerException *this_00;
  Code func;
  string local_f8;
  DataRegister local_d8;
  Code local_c8;
  Param local_50;
  undefined1 local_48;
  undefined **local_40;
  undefined1 local_38;
  
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_string_length = local_f8._M_string_length & 0xffffffffffffff00;
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261bb0;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::moveq(&local_c8,'\0',(DataRegister *)&local_f8);
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261d18;
  local_f8.field_2._M_local_buf[0] = 5;
  local_f8._M_string_length = (size_type)&PTR_getXn_00261c50;
  local_f8.field_2._8_3_ = 0x2003b;
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::move(&local_c8,(Param *)&local_f8,(Param *)&local_d8,BYTE);
  local_f8._M_string_length = local_f8._M_string_length & 0xffffffffffffff00;
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261bb0;
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::add(&local_c8,(Param *)&local_f8,&local_d8,WORD,false);
  local_f8._M_string_length = local_f8._M_string_length & 0xffffffffffffff00;
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261bb0;
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::add(&local_c8,(Param *)&local_f8,&local_d8,WORD,false);
  local_f8._M_string_length = local_f8._M_string_length & 0xffffffffffffff00;
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261bb0;
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::add(&local_c8,(Param *)&local_f8,&local_d8,WORD,false);
  local_f8._M_string_length = CONCAT71(local_f8._M_string_length._1_7_,1);
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261bb0;
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  md::Code::add(&local_c8,(Param *)&local_f8,&local_d8,WORD,false);
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_f8._M_string_length = CONCAT44(2,this->_ai_table_addr);
  md::Code::lea(&local_c8,(Param *)&local_f8,(AddressRegister *)&local_d8);
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_f8.field_2._M_allocated_capacity = (size_type)&local_40;
  local_38 = 0;
  local_40 = &PTR_getXn_00261bb0;
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261d58;
  local_f8.field_2._8_4_ = 2;
  local_f8.field_2._M_local_buf[0xc] = '\0';
  local_48 = 0;
  local_50._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_f8._M_string_length = (size_type)&local_d8;
  md::Code::move(&local_c8,(Param *)&local_f8,&local_50,LONG);
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"default_address","");
  md::Code::bmi(&local_c8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_string_length = local_f8._M_string_length & 0xffffffffffffff00;
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261bb0;
  local_d8.super_Register._code = '\0';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::move(&local_c8,(Param *)&local_f8,(Param *)&local_d8,LONG);
  local_f8._M_string_length = local_f8._M_string_length & 0xffffffffffffff00;
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261bb0;
  md::Code::moveq(&local_c8,'\0',(DataRegister *)&local_f8);
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261d18;
  local_f8.field_2._M_allocated_capacity =
       local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_f8._M_string_length = (size_type)&PTR_getXn_00261c50;
  local_f8.field_2._8_3_ = 0x20000;
  md::Code::jmp(&local_c8,(Param *)&local_f8);
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"default_address","");
  md::Code::label(&local_c8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_f8._M_string_length = 0x2001a8ada;
  md::Code::jsr(&local_c8,(Param *)&local_f8);
  md::Code::rts(&local_c8);
  md::ROM::set_code(rom,0x1a83f0,&local_c8);
  pvVar2 = md::Code::get_bytes(&local_c8);
  if ((pointer)0xffffffffffe57be6 <
      (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish +
      (-0x29 - (long)(pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&local_c8._labels._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_c8._pending_branches._M_t);
    if (local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8._bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8._bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8._bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"Replacement function is too large and is overlapping other code!",
             "");
  LandstalkerException::LandstalkerException(this_00,&local_f8);
  __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        md::Code func;
        {
            func.moveq(0, reg_D0);
            // Store entity ID in D0, and multiply it by 8 to form an offset
            func.moveb(addr_(reg_A5, 0x3B), reg_D0);
            func.addw(reg_D0, reg_D0);
            func.addw(reg_D0, reg_D0);
            func.addw(reg_D0, reg_D0);
            // Add "offset" D1 (initialized externally, either 0 or 4) to get AI variant A or B.
            func.addw(reg_D1, reg_D0);
            // Fetch the address from the AI jump table, storing it in D0 to save a CMPA
            func.lea(_ai_table_addr, reg_A0);
            func.movel(addr_(reg_A0, reg_D0), reg_D0);
            func.bmi("default_address");
            {
                // Put the address back in an address register, and jump on it
                func.movel(reg_D0, reg_A0);
                func.moveq(0, reg_D0);
                func.jmp(addr_(reg_A0));
            }
            func.label("default_address");
            {
                func.jsr(0x1A8ADA); // LoadSpecialAI
                func.rts();
            }
        }

        rom.set_code(0x1A83F0, func);
        if(0x1A83F0 + func.get_bytes().size() > offsets::ENEMY_AI_TABLE)
            throw LandstalkerException("Replacement function is too large and is overlapping other code!");
    }